

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O3

int CVmSaveFile::restore_get_image(osfildef *fp,char *fname_buf,size_t fname_buf_len)

{
  size_t sVar1;
  ulong __size;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char buf [128];
  undefined2 local_a8;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char local_98;
  
  sVar1 = fread(&local_a8,0x31,1,(FILE *)fp);
  if (sVar1 == 1) {
    auVar2[0] = -((char)local_a8 == 'T');
    auVar2[1] = -(local_a8._1_1_ == '3');
    auVar2[2] = -(cStack_a6 == '-');
    auVar2[3] = -(cStack_a5 == 's');
    auVar2[4] = -(cStack_a4 == 't');
    auVar2[5] = -(cStack_a3 == 'a');
    auVar2[6] = -(cStack_a2 == 't');
    auVar2[7] = -(cStack_a1 == 'e');
    auVar2[8] = -(cStack_a0 == '-');
    auVar2[9] = -(cStack_9f == 'v');
    auVar2[10] = -(cStack_9e == '0');
    auVar2[0xb] = -(cStack_9d == '0');
    auVar2[0xc] = -(cStack_9c == '0');
    auVar2[0xd] = -(cStack_9b == 'A');
    auVar2[0xe] = -(cStack_9a == '\r');
    auVar2[0xf] = -(cStack_99 == '\n');
    auVar3[0] = -(local_98 == '\x1a');
    auVar3[1] = 0xff;
    auVar3[2] = 0xff;
    auVar3[3] = 0xff;
    auVar3[4] = 0xff;
    auVar3[5] = 0xff;
    auVar3[6] = 0xff;
    auVar3[7] = 0xff;
    auVar3[8] = 0xff;
    auVar3[9] = 0xff;
    auVar3[10] = 0xff;
    auVar3[0xb] = 0xff;
    auVar3[0xc] = 0xff;
    auVar3[0xd] = 0xff;
    auVar3[0xe] = 0xff;
    auVar3[0xf] = 0xff;
    auVar3 = auVar3 & auVar2;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff) {
      return 0x4b1;
    }
    sVar1 = fread(&local_a8,2,1,(FILE *)fp);
    if ((sVar1 == 1) && (__size = (ulong)local_a8, __size < fname_buf_len)) {
      sVar1 = fread(fname_buf,__size,1,(FILE *)fp);
      if (sVar1 != 1) {
        return 0x65;
      }
      fname_buf[__size] = '\0';
      return 0;
    }
  }
  return 0x65;
}

Assistant:

int CVmSaveFile::restore_get_image(osfildef *fp,
                                   char *fname_buf, size_t fname_buf_len)
{
    /* read the signature, size/checksum, and timestamp fields */
    char buf[128];
    if (osfrb(fp, buf, sizeof(VMSAVEFILE_SIG)-1 + 8 + 24))
        return VMERR_READ_FILE;

    /* check the signature */
    if (memcmp(buf, VMSAVEFILE_SIG, sizeof(VMSAVEFILE_SIG)-1) != 0)
        return VMERR_NOT_SAVED_STATE;

    /* read the length of the image file name */
    if (osfrb(fp, buf, 2))
        return VMERR_READ_FILE;

    /* get the length from the buffer */
    size_t len = osrp2(buf);

    /* if it won't fit in the buffer, return an error */
    if (len + 1 > fname_buf_len)
        return VMERR_READ_FILE;

    /* read the name into the caller's buffer */
    if (osfrb(fp, fname_buf, len))
        return VMERR_READ_FILE;

    /* null-terminate the name */
    fname_buf[len] = '\0';

    /* success */
    return 0;
}